

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerHeap::swapHeap(TimerHeap *this,size_t index1,size_t index2)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  psVar1 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar2 = psVar1[index1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar1[index1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar1[index2].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar1[index2].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var3 = psVar1[index2].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  psVar1[index2].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       psVar1[index1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  psVar1[index1].super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  return;
}

Assistant:

void TimerHeap::swapHeap(size_t index1, size_t index2) {
    swap(timerHeap_[index1], timerHeap_[index2]);
}